

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

int absl::lts_20240722::base_internal::LLA_SkiplistLevels(size_t size,size_t base,uint32_t *random)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long extraout_RDX;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar3 = size - 0x28;
  iVar5 = 0;
  if (base < size) {
    iVar5 = 0;
    do {
      iVar5 = iVar5 + 1;
      size = size >> 1;
    } while (base < size);
  }
  uVar3 = uVar3 >> 3;
  if (random == (uint32_t *)0x0) {
    iVar8 = 1;
  }
  else {
    size = (size_t)*random;
    iVar8 = 0;
    do {
      uVar10 = (int)size * 0x41c64e6d + 0x3039;
      size = (size_t)uVar10;
      iVar8 = iVar8 + 1;
    } while ((uVar10 >> 0x1e & 1) == 0);
    *random = uVar10;
  }
  uVar10 = iVar8 + iVar5;
  uVar9 = (ulong)uVar10;
  if (uVar3 < (ulong)(long)(int)uVar10) {
    uVar10 = (uint)uVar3;
  }
  if (0 < (int)uVar10) {
    uVar2 = 0x1d;
    if (uVar10 < 0x1d) {
      uVar2 = uVar10;
    }
    return uVar2;
  }
  LLA_SkiplistLevels();
  iVar5 = *(int *)(size + 0x20);
  lVar4 = (long)iVar5;
  lVar6 = lVar4;
  uVar3 = size;
  if (0 < lVar4) {
    do {
      lVar7 = lVar6 + -1;
      do {
        uVar11 = uVar3;
        uVar3 = *(ulong *)(uVar11 + 0x28 + lVar7 * 8);
        if (uVar3 == 0) break;
      } while (uVar3 < uVar9);
      *(ulong *)(extraout_RDX + lVar7 * 8) = uVar11;
      bVar1 = 1 < lVar6;
      lVar6 = lVar7;
      uVar3 = uVar11;
    } while (bVar1);
  }
  uVar10 = *(uint *)(uVar9 + 0x20);
  if (iVar5 < (int)uVar10) {
    do {
      iVar5 = iVar5 + 1;
      *(size_t *)(extraout_RDX + lVar4 * 8) = size;
      lVar4 = lVar4 + 1;
      *(int *)(size + 0x20) = iVar5;
      uVar10 = *(uint *)(uVar9 + 0x20);
    } while (lVar4 < (int)uVar10);
  }
  uVar2 = (uint)lVar4;
  if (uVar10 != 0) {
    uVar3 = 0;
    do {
      *(undefined8 *)(uVar9 + 0x28 + uVar3 * 8) =
           *(undefined8 *)(*(long *)(extraout_RDX + uVar3 * 8) + 0x28 + uVar3 * 8);
      *(ulong *)(*(long *)(extraout_RDX + uVar3 * 8) + 0x28 + uVar3 * 8) = uVar9;
      uVar3 = uVar3 + 1;
      uVar2 = uVar10;
    } while (uVar10 != uVar3);
  }
  return uVar2;
}

Assistant:

static int LLA_SkiplistLevels(size_t size, size_t base, uint32_t *random) {
  // max_fit is the maximum number of levels that will fit in a node for the
  // given size.   We can't return more than max_fit, no matter what the
  // random number generator says.
  size_t max_fit = (size - offsetof(AllocList, next)) / sizeof(AllocList *);
  int level = IntLog2(size, base) + (random != nullptr ? Random(random) : 1);
  if (static_cast<size_t>(level) > max_fit) level = static_cast<int>(max_fit);
  if (level > kMaxLevel - 1) level = kMaxLevel - 1;
  ABSL_RAW_CHECK(level >= 1, "block not big enough for even one level");
  return level;
}